

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::
ValidateEnumTest_GenerateEnumDataSequentialWithOverflow_Test::
ValidateEnumTest_GenerateEnumDataSequentialWithOverflow_Test
          (ValidateEnumTest_GenerateEnumDataSequentialWithOverflow_Test *this)

{
  ValidateEnumTest_GenerateEnumDataSequentialWithOverflow_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ValidateEnumTest_GenerateEnumDataSequentialWithOverflow_Test_029c68b8;
  return;
}

Assistant:

TEST(ValidateEnumTest, GenerateEnumDataSequentialWithOverflow) {
  std::vector<int32_t> values;
  for (int32_t i = -33000; i < 33000; ++i) {
    values.push_back(i);
  }
  const auto data = GenerateEnumData(values);
  EXPECT_THAT(ExtractHeader(data),
              HeaderHas(
                  // The sequence starts at the minimum possible value,
                  std::numeric_limits<int16_t>::min(),
                  // and it is as long as possible.
                  0xFFFF,
                  // we have some values in the bitmap
                  Gt(0),
                  // we have some in the fallback
                  Gt(0)));

  TestRoundTrip(values, __LINE__);
}